

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFOBSFireFightingFactored.cpp
# Opt level: O0

Scope * __thiscall
ProblemFOBSFireFightingFactored::GetHousesAgentInfluences
          (ProblemFOBSFireFightingFactored *this,Index agI)

{
  long in_RSI;
  Scope *in_RDI;
  Index hI;
  Scope *allHouses;
  Scope *this_00;
  undefined4 local_1c;
  
  this_00 = in_RDI;
  Scope::Scope(in_RDI);
  for (local_1c = 0; (ulong)local_1c < *(ulong *)(in_RSI + 0x710); local_1c = local_1c + 1) {
    Scope::Insert(this_00,(Index)((ulong)in_RDI >> 0x20));
  }
  return this_00;
}

Assistant:

Scope ProblemFOBSFireFightingFactored::GetHousesAgentInfluences(Index agI) const
{
    Scope allHouses;
    for(Index hI=0; hI < _m_nrHouses; hI++)
        allHouses.Insert(hI);
    return(allHouses);
}